

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O2

void xmlXIncludeFreeContext(xmlXIncludeCtxtPtr ctxt)

{
  xmlXIncludeRefPtr *ppxVar1;
  long lVar2;
  long lVar3;
  
  if (ctxt != (xmlXIncludeCtxtPtr)0x0) {
    if (ctxt->urlTab != (xmlXIncludeDoc *)0x0) {
      lVar3 = 0;
      for (lVar2 = 0; lVar2 < ctxt->urlNr; lVar2 = lVar2 + 1) {
        xmlFreeDoc(*(xmlDocPtr *)((long)&ctxt->urlTab->doc + lVar3));
        (*xmlFree)(*(void **)((long)&ctxt->urlTab->url + lVar3));
        lVar3 = lVar3 + 0x18;
      }
      (*xmlFree)(ctxt->urlTab);
    }
    for (lVar2 = 0; ppxVar1 = ctxt->incTab, lVar2 < ctxt->incNr; lVar2 = lVar2 + 1) {
      if (ppxVar1[lVar2] != (xmlXIncludeRefPtr)0x0) {
        xmlXIncludeFreeRef(ppxVar1[lVar2]);
      }
    }
    if (ppxVar1 != (xmlXIncludeRefPtr *)0x0) {
      (*xmlFree)(ppxVar1);
    }
    if (ctxt->txtTab != (xmlXIncludeTxt *)0x0) {
      lVar3 = 0;
      lVar2 = 0;
      while( true ) {
        if (ctxt->txtNr <= lVar2) break;
        (*xmlFree)(*(void **)((long)&ctxt->txtTab->text + lVar3));
        (*xmlFree)(*(void **)((long)&ctxt->txtTab->url + lVar3));
        lVar2 = lVar2 + 1;
        lVar3 = lVar3 + 0x10;
      }
      (*xmlFree)(ctxt->txtTab);
    }
    if (ctxt->xpctxt != (xmlXPathContextPtr)0x0) {
      xmlXPathFreeContext(ctxt->xpctxt);
    }
    (*xmlFree)(ctxt);
    return;
  }
  return;
}

Assistant:

void
xmlXIncludeFreeContext(xmlXIncludeCtxtPtr ctxt) {
    int i;

    if (ctxt == NULL)
	return;
    if (ctxt->urlTab != NULL) {
	for (i = 0; i < ctxt->urlNr; i++) {
	    xmlFreeDoc(ctxt->urlTab[i].doc);
	    xmlFree(ctxt->urlTab[i].url);
	}
	xmlFree(ctxt->urlTab);
    }
    for (i = 0;i < ctxt->incNr;i++) {
	if (ctxt->incTab[i] != NULL)
	    xmlXIncludeFreeRef(ctxt->incTab[i]);
    }
    if (ctxt->incTab != NULL)
	xmlFree(ctxt->incTab);
    if (ctxt->txtTab != NULL) {
	for (i = 0;i < ctxt->txtNr;i++) {
	    xmlFree(ctxt->txtTab[i].text);
	    xmlFree(ctxt->txtTab[i].url);
	}
	xmlFree(ctxt->txtTab);
    }
#ifdef LIBXML_XPTR_ENABLED
    if (ctxt->xpctxt != NULL)
	xmlXPathFreeContext(ctxt->xpctxt);
#endif
    xmlFree(ctxt);
}